

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isNumber
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  
  bVar1 = **(byte **)this;
  if ((bVar1 & 0xf8 | 8) == 0x28) {
    return true;
  }
  return bVar1 == 0x1b || (bVar1 & 0xf0) == 0x30;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }